

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMap<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Field<google::protobuf::json_internal::UnparseProto3Type> field)

{
  Msg<google::protobuf::json_internal::UnparseProto3Type> *pMVar1;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *writer_00;
  bool bVar2;
  Status *pSVar3;
  UntypedMessage **ppUVar4;
  Field pFVar5;
  bool *pbVar6;
  char cVar7;
  string_view local_d0;
  byte local_b9;
  string_view local_b8;
  string_view local_a8;
  byte local_92;
  byte local_91;
  undefined1 local_90 [8];
  StatusOr<bool> is_empty;
  Desc<google::protobuf::json_internal::UnparseProto3Type> *type;
  undefined1 local_60 [8];
  StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> entry;
  size_t i;
  UntypedMessage *pUStack_40;
  bool first;
  size_t count;
  Field<google::protobuf::json_internal::UnparseProto3Type> local_28;
  Field<google::protobuf::json_internal::UnparseProto3Type> field_local;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *msg_local;
  JsonWriter *writer_local;
  Status *_status;
  
  local_28 = field;
  field_local = (Field<google::protobuf::json_internal::UnparseProto3Type>)msg;
  msg_local = (Msg<google::protobuf::json_internal::UnparseProto3Type> *)writer;
  writer_local = (JsonWriter *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&count,"{");
  JsonWriter::Write(writer,_count);
  JsonWriter::Push((JsonWriter *)msg_local);
  pUStack_40 = (UntypedMessage *)UnparseProto3Type::GetSize(local_28,(Msg *)field_local);
  i._7_1_ = 1;
  entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_1.data_ =
       (UntypedMessage *)0x0;
  while( true ) {
    if (pUStack_40 <=
        entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_1.
        data_) {
      JsonWriter::Pop((JsonWriter *)msg_local);
      if ((i._7_1_ & 1) == 0) {
        JsonWriter::NewLine((JsonWriter *)msg_local);
      }
      pMVar1 = msg_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"}");
      JsonWriter::Write((JsonWriter *)pMVar1,local_d0);
      absl::lts_20240722::OkStatus();
      return (Status)(uintptr_t)this;
    }
    UnparseProto3Type::GetMessage
              ((UnparseProto3Type *)local_60,local_28,(Msg *)field_local,
               (size_t)entry.
                       super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.
                       field_1);
    pSVar3 = absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>::
             status((StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)local_60);
    absl::lts_20240722::Status::Status((Status *)this,pSVar3);
    bVar2 = absl::lts_20240722::Status::ok((Status *)this);
    cVar7 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (!(bool)cVar7) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ppUVar4 = absl::lts_20240722::
                StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>::operator*
                          ((StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)
                           local_60);
      is_empty.super_StatusOrData<bool>._8_8_ = UnparseProto3Type::GetDesc(*ppUVar4);
      ppUVar4 = absl::lts_20240722::
                StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>::operator*
                          ((StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)
                           local_60);
      pMVar1 = *ppUVar4;
      pFVar5 = Proto3Type::ValueField((Desc *)is_empty.super_StatusOrData<bool>._8_8_);
      IsEmptyValue<google::protobuf::json_internal::UnparseProto3Type>
                ((anon_unknown_4 *)local_90,pMVar1,pFVar5);
      local_91 = 0;
      pSVar3 = absl::lts_20240722::StatusOr<bool>::status((StatusOr<bool> *)local_90);
      absl::lts_20240722::Status::Status((Status *)this,pSVar3);
      bVar2 = absl::lts_20240722::Status::ok((Status *)this);
      cVar7 = ((bVar2 ^ 0xffU) & 1) != 0;
      if ((bool)cVar7) {
        local_91 = 1;
      }
      if ((local_91 & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      if (!(bool)cVar7) {
        pbVar6 = absl::lts_20240722::StatusOr<bool>::operator*((StatusOr<bool> *)local_90);
        if ((*pbVar6 & 1U) == 0) {
          JsonWriter::WriteComma((JsonWriter *)msg_local,(bool *)((long)&i + 7));
          JsonWriter::NewLine((JsonWriter *)msg_local);
          writer_00 = msg_local;
          local_92 = 0;
          ppUVar4 = absl::lts_20240722::
                    StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>::operator*
                              ((StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)
                               local_60);
          pMVar1 = *ppUVar4;
          pFVar5 = Proto3Type::KeyField((Desc *)is_empty.super_StatusOrData<bool>._8_8_);
          WriteMapKey<google::protobuf::json_internal::UnparseProto3Type>
                    (this,(JsonWriter *)writer_00,pMVar1,pFVar5);
          bVar2 = absl::lts_20240722::Status::ok((Status *)this);
          cVar7 = ((bVar2 ^ 0xffU) & 1) != 0;
          if ((bool)cVar7) {
            local_92 = 1;
          }
          if ((local_92 & 1) == 0) {
            absl::lts_20240722::Status::~Status((Status *)this);
          }
          pMVar1 = msg_local;
          if (!(bool)cVar7) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,":");
            JsonWriter::Write((JsonWriter *)pMVar1,local_a8);
            pMVar1 = msg_local;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8," ");
            JsonWriter::Whitespace((JsonWriter *)pMVar1,local_b8);
            pMVar1 = msg_local;
            local_b9 = 0;
            pFVar5 = Proto3Type::ValueField((Desc *)is_empty.super_StatusOrData<bool>._8_8_);
            ppUVar4 = absl::lts_20240722::
                      StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>::operator*
                                ((StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>
                                  *)local_60);
            (anonymous_namespace)::
            WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                      ((_anonymous_namespace_ *)this,(JsonWriter *)pMVar1,pFVar5,*ppUVar4);
            bVar2 = absl::lts_20240722::Status::ok((Status *)this);
            cVar7 = ((bVar2 ^ 0xffU) & 1) != 0;
            if ((bool)cVar7) {
              local_b9 = 1;
            }
            if ((local_b9 & 1) == 0) {
              absl::lts_20240722::Status::~Status((Status *)this);
            }
            if (!(bool)cVar7) {
              cVar7 = '\0';
            }
          }
        }
        else {
          cVar7 = '\x04';
        }
      }
      absl::lts_20240722::StatusOr<bool>::~StatusOr((StatusOr<bool> *)local_90);
    }
    absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOr
              ((StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)local_60);
    if ((cVar7 != '\0') && (cVar7 == '\x01')) break;
    entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_1.data_
         = (UntypedMessage *)
           ((long)&(entry.
                    super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.
                    field_1.data_)->desc_ + 1);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMap(JsonWriter& writer, const Msg<Traits>& msg,
                      Field<Traits> field) {
  writer.Write("{");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    absl::StatusOr<const Msg<Traits>*> entry =
        Traits::GetMessage(field, msg, i);
    RETURN_IF_ERROR(entry.status());
    const Desc<Traits>& type = Traits::GetDesc(**entry);

    auto is_empty = IsEmptyValue<Traits>(**entry, Traits::ValueField(type));
    RETURN_IF_ERROR(is_empty.status());
    if (*is_empty) {
      // Empty google.protobuf.Values are silently discarded.
      continue;
    }

    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(
        WriteMapKey<Traits>(writer, **entry, Traits::KeyField(type)));
    writer.Write(":");
    writer.Whitespace(" ");
    RETURN_IF_ERROR(
        WriteSingular<Traits>(writer, Traits::ValueField(type), **entry));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("}");
  return absl::OkStatus();
}